

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void __thiscall
kj::Maybe<kj::Exception>::Maybe(Maybe<kj::Exception> *this,Maybe<kj::Exception> *other)

{
  bool bVar1;
  undefined8 uVar2;
  
  bVar1 = (other->ptr).isSet;
  (this->ptr).isSet = bVar1;
  if (bVar1 == true) {
    (this->ptr).field_1.value.ownFile.content.ptr = (other->ptr).field_1.value.ownFile.content.ptr;
    (this->ptr).field_1.value.ownFile.content.size_ =
         (other->ptr).field_1.value.ownFile.content.size_;
    (this->ptr).field_1.value.ownFile.content.disposer =
         (other->ptr).field_1.value.ownFile.content.disposer;
    (other->ptr).field_1.value.ownFile.content.ptr = (char *)0x0;
    (other->ptr).field_1.value.ownFile.content.size_ = 0;
    uVar2 = *(undefined8 *)((long)&(other->ptr).field_1 + 0x20);
    (this->ptr).field_1.value.file = (other->ptr).field_1.value.file;
    *(undefined8 *)((long)&(this->ptr).field_1 + 0x20) = uVar2;
    (this->ptr).field_1.value.description.content.ptr =
         (other->ptr).field_1.value.description.content.ptr;
    (this->ptr).field_1.value.description.content.size_ =
         (other->ptr).field_1.value.description.content.size_;
    (this->ptr).field_1.value.description.content.disposer =
         (other->ptr).field_1.value.description.content.disposer;
    (other->ptr).field_1.value.description.content.ptr = (char *)0x0;
    (other->ptr).field_1.value.description.content.size_ = 0;
    (this->ptr).field_1.value.context.ptr.disposer = (other->ptr).field_1.value.context.ptr.disposer
    ;
    (this->ptr).field_1.value.context.ptr.ptr = (other->ptr).field_1.value.context.ptr.ptr;
    (other->ptr).field_1.value.context.ptr.ptr = (Context *)0x0;
    memcpy((void *)((long)&(this->ptr).field_1 + 0x50),(void *)((long)&(other->ptr).field_1 + 0x50),
           0x104);
    return;
  }
  return;
}

Assistant:

inline NullableValue(NullableValue&& other)
      : isSet(other.isSet) {
    if (isSet) {
      ctor(value, kj::mv(other.value));
    }
  }